

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O0

int mdns::openSocket(void)

{
  undefined1 local_b0 [8];
  group_req mgroup;
  sockaddr_in sin;
  int st;
  uint32_t val;
  int fd;
  
  val = socket(2,2,0);
  if ((int)val < 0) {
    perror("Creating socket failed");
    val = 0xffffffff;
  }
  else {
    sin.sin_zero[4] = '\x01';
    sin.sin_zero[5] = '\0';
    sin.sin_zero[6] = '\0';
    sin.sin_zero[7] = '\0';
    sin.sin_zero._0_4_ = setsockopt(val,1,6,sin.sin_zero + 4,4);
    if ((int)sin.sin_zero._0_4_ < 0) {
      perror("Setting SO_BROADCAST failed");
      close(val);
      val = 0xffffffff;
    }
    else {
      sin.sin_zero._0_4_ = setsockopt(val,1,2,sin.sin_zero + 4,4);
      if ((int)sin.sin_zero._0_4_ < 0) {
        perror("Setting SO_REUSEADDR failed");
        close(val);
        val = 0xffffffff;
      }
      else {
        sin.sin_zero._0_4_ = setsockopt(val,0,0x21,&openSocket::MdnsTTL,4);
        if ((int)sin.sin_zero._0_4_ < 0) {
          perror("Setting ttl failed");
          close(val);
          val = 0xffffffff;
        }
        else {
          memset(&mgroup.gr_group.__ss_align,0,0x10);
          mgroup.gr_group.__ss_align._0_2_ = 2;
          mgroup.gr_group.__ss_align._2_2_ = htons(0x14e9);
          mgroup.gr_group.__ss_align._4_4_ = 0;
          sin.sin_zero._0_4_ = bind(val,(sockaddr *)&mgroup.gr_group.__ss_align,0x10);
          if ((int)sin.sin_zero._0_4_ < 0) {
            perror("Falied to bind");
            close(val);
            val = 0xffffffff;
          }
          else {
            memset(local_b0,0,0x88);
            inet_aton("224.0.0.251",(in_addr *)((long)&mgroup.gr_group.__ss_align + 4));
            mgroup.gr_interface._2_2_ = mgroup.gr_group.__ss_align._2_2_;
            mgroup.gr_interface._0_2_ = (undefined2)mgroup.gr_group.__ss_align;
            mgroup._4_4_ = mgroup.gr_group.__ss_align._4_4_;
            mgroup.gr_group._0_8_ = sin._0_8_;
            sin.sin_zero._0_4_ = setsockopt(val,0,0x2a,local_b0,0x88);
            if ((int)sin.sin_zero._0_4_ < 0) {
              perror(" ! Failed to join multicast group");
              close(val);
              val = 0xffffffff;
            }
          }
        }
      }
    }
  }
  return val;
}

Assistant:

int openSocket()
{
    static const uint32_t MdnsTTL = 255;

    int fd = socket(AF_INET, SOCK_DGRAM, 0);
    if (fd < 0) {
        perror("Creating socket failed");
        return -1;
    }

    uint32_t val = 1;

    int st = setsockopt(fd, SOL_SOCKET, SO_BROADCAST, &val, sizeof(val));
    if (st < 0) {
        perror("Setting SO_BROADCAST failed");
        close(fd);
        return -1;
    }
    st = setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &val, sizeof(val));
    if (st < 0) {
        perror("Setting SO_REUSEADDR failed");
        close(fd);
        return -1;
    }

    st = setsockopt(fd, IPPROTO_IP, IP_MULTICAST_TTL, &MdnsTTL, sizeof(MdnsTTL));
    if (st < 0) {
        perror("Setting ttl failed");
        close(fd);
        return -1;
    }

    struct sockaddr_in sin;
    memset(&sin, 0, sizeof(sin));
    sin.sin_family = AF_INET;
    sin.sin_port = htons(5353);
    sin.sin_addr.s_addr = INADDR_ANY;
    st = bind(fd, (const struct sockaddr *) &sin, sizeof(sin));
    if (st < 0) {
        perror("Falied to bind");
        close(fd);
        return -1;
    }

    struct group_req mgroup;
    bzero(&mgroup, sizeof mgroup);
    inet_aton("224.0.0.251", &sin.sin_addr);
    memcpy(&mgroup.gr_group, &sin, sizeof sin);

    st = setsockopt(fd, IPPROTO_IP, MCAST_JOIN_GROUP, reinterpret_cast<const char*>(&mgroup), sizeof(mgroup));
    if (st < 0) {
        perror(" ! Failed to join multicast group");
        close(fd);
        return -1;
    }

    return fd;
}